

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

args * djb::tab_r::extract_ggx_args(args *__return_storage_ptr__,tab_r *tab)

{
  int i;
  int iVar1;
  float __x;
  float fVar2;
  float extraout_XMM0_Da;
  double dVar3;
  vec3 wm;
  vec3 local_9c;
  vec3 local_90;
  args local_80;
  
  iVar1 = 0;
  do {
    __x = (float)iVar1 * 0.001953125 * (float)iVar1 * 0.001953125 * 3.1415927 * 0.5;
    fVar2 = cosf(__x);
    local_9c.x = sinf(__x);
    local_9c.y = 0.0;
    local_90.x = 0.0;
    local_90.y = 0.0;
    local_90.z = 1.0;
    local_9c.z = fVar2;
    microfacet::args::normalmap(&local_80,&local_90,1.0,1.0,0.0);
    microfacet::ndf((microfacet *)tab,&local_9c,&local_80);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x200);
  (*(tab->super_radial).super_microfacet.super_brdf._vptr_brdf[0xe])(0x3f800000,tab);
  dVar3 = 1.0 / (double)(extraout_XMM0_Da * 3.1415927);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  fprintf(_stdout,"djb_verbose: GGX_alpha = %.9f\n");
  local_80.mtra.r[0].x = 0.0;
  local_80.mtra.r[0].y = 0.0;
  local_80.mtra.r[0].z = 1.0;
  microfacet::args::normalmap
            (__return_storage_ptr__,(vec3 *)&local_80,(float)dVar3,(float)dVar3,0.0);
  return __return_storage_ptr__;
}

Assistant:

microfacet::args tab_r::extract_ggx_args(const tab_r &tab)
{
	int cnt = 512;
	double du = 4 * (double)m_pi() / cnt;
	double nint = 0;

	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t tm = sqr(u) * m_pi() / 2;
		float_t zm = cos(tm), z_m = sin(tm);
		vec3 wm = vec3(z_m, 0, zm);

		nint+= (double)(u * sqr(z_m) * tab.ndf(wm));
	}
	nint*= du;

	nint = sqrt(1 / (double)(tab.ndf_std_radial(1) * m_pi()));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: GGX_alpha = %.9f\n", nint);
#endif
	return microfacet::args::isotropic(nint);
}